

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_217::SignaturePruning::run(SignaturePruning *this,Module *module)

{
  Type TVar1;
  Module *pMVar2;
  bool bVar3;
  PassOptions *pPVar4;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *this_00;
  mapped_type_conflict *this_01;
  reference ppCVar5;
  Call *pCVar6;
  Expression **ppEVar7;
  reference ppCVar8;
  reference puVar9;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *this_02;
  reference this_03;
  pointer pEVar10;
  Function *pFVar11;
  reference __in;
  type *this_04;
  mapped_type *pmVar12;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_05;
  size_t sVar13;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_06;
  HeapType *this_07;
  reference puVar14;
  size_type sVar15;
  PassRunner *runner;
  Type *__x;
  mapped_type *pmVar16;
  reference ppFVar17;
  Signature SVar18;
  optional<wasm::HeapType> oVar19;
  Function *func_2;
  iterator __end3_4;
  iterator __begin3_4;
  type *__range3_4;
  Tuple local_568;
  Type local_550;
  Signature local_548;
  uint local_534;
  undefined1 local_530 [4];
  Index i_2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  undefined1 local_500 [8];
  SortedVector removedIndexes;
  Type oldParams;
  undefined1 local_4d8 [4];
  Index i_1;
  SortedVector unusedParams;
  iterator iStack_4b8;
  uint i;
  iterator __end3_3;
  iterator __begin3_3;
  SortedVector *__range3_3;
  SortedVector optimizedIndexes;
  optional<wasm::HeapType> super;
  size_t numParams;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *usedParams;
  mapped_type *info_1;
  Signature sig;
  type *funcs;
  type *type;
  _Self local_430;
  iterator __end2_2;
  iterator __begin2_2;
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  *__range2_2;
  SubTypes subTypes;
  Function *func_1;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  uint local_374;
  _Node_iterator_base<unsigned_int,_false> _Stack_370;
  uint index;
  iterator __end3_2;
  iterator __begin3_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3_2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *allUsedParams;
  BasicType local_344;
  Type local_340;
  Type calledType;
  CallRef *callRef;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range3_1;
  BasicType local_30c;
  Expression *local_308;
  Expression *target;
  size_t local_2f8;
  char *pcStack_2f0;
  Call *local_2e8;
  Call *call;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range3;
  mapped_type_conflict *info;
  Function *func;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
  sigFuncs;
  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
  allInfo;
  function<void_(wasm::Function_*,_Info_&)> local_208;
  undefined1 local_1e8 [8];
  ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap> analysis;
  Fatal local_1a0;
  Module *local_18;
  Module *module_local;
  SignaturePruning *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  bVar3 = FeatureSet::hasGC(&module->features);
  if (bVar3) {
    pPVar4 = Pass::getPassOptions(&this->super_Pass);
    if ((pPVar4->closedWorld & 1U) == 0) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,(char (*) [41])"SignaturePruning requires --closed-world");
      Fatal::~Fatal(&local_1a0);
    }
    bVar3 = std::
            vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ::empty(&local_18->tables);
    pMVar2 = local_18;
    if (bVar3) {
      std::
      function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info&)>
      ::
      function<wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::_lambda(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info&)_1_,void>
                ((function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::run(wasm::Module*)::Info&)>
                  *)&local_208,(anon_class_1_0_00000001 *)((long)&allInfo._M_h._M_single_bucket + 7)
                );
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
      ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_1e8,pMVar2,(Func *)&local_208);
      std::function<void_(wasm::Function_*,_Info_&)>::~function(&local_208);
      std::
      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
      ::unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                       *)&sigFuncs.List.
                          super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                          ._M_impl._M_node._M_size);
      InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                          *)&__range2);
      this_00 = &local_18->functions;
      __end2 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::begin(this_00);
      f = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
          std::
          vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
          ::end(this_00);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                         *)&f), pMVar2 = local_18, bVar3) {
        func = (Function *)
               __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end2);
        info = (mapped_type_conflict *)
               std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)func);
        this_01 = std::
                  map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                  ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                                *)&analysis,(key_type *)&info);
        __end3 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(&this_01->calls);
        call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                                 (&this_01->calls);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                           *)&call), bVar3) {
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                    ::operator*(&__end3);
          local_2e8 = *ppCVar5;
          local_2f8 = (local_2e8->target).super_IString.str._M_len;
          pcStack_2f0 = (local_2e8->target).super_IString.str._M_str;
          pFVar11 = Module::getFunction(local_18,(Name)(local_2e8->target).super_IString.str);
          pmVar12 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&sigFuncs.List.
                                     super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                     ._M_impl._M_node._M_size,&pFVar11->type);
          std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::push_back
                    (&pmVar12->calls,&local_2e8);
          Intrinsics::Intrinsics((Intrinsics *)&target,local_18);
          pCVar6 = Intrinsics::isCallWithoutEffects((Intrinsics *)&target,(Expression *)local_2e8);
          if (pCVar6 != (Call *)0x0) {
            ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                (&(local_2e8->operands).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
            local_308 = *ppEVar7;
            local_30c = unreachable;
            bVar3 = wasm::Type::operator!=(&local_308->type,&local_30c);
            if (bVar3) {
              __range3_1 = (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                           wasm::Type::getHeapType(&local_308->type);
              pmVar12 = std::
                        unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                      *)&sigFuncs.List.
                                         super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                         ._M_impl._M_node._M_size,(key_type *)&__range3_1);
              pmVar12->optimizable = false;
            }
          }
          __gnu_cxx::
          __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
          ::operator++(&__end3);
        }
        __end3_1 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin
                             (&this_01->callRefs);
        callRef = (CallRef *)
                  std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end
                            (&this_01->callRefs);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                                   *)&callRef), bVar3) {
          ppCVar8 = __gnu_cxx::
                    __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                    ::operator*(&__end3_1);
          calledType.id = (uintptr_t)*ppCVar8;
          local_340.id = (((CallRef *)calledType.id)->target->type).id;
          local_344 = unreachable;
          bVar3 = wasm::Type::operator!=(&local_340,&local_344);
          if (bVar3) {
            allUsedParams =
                 (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)wasm::Type::getHeapType(&local_340);
            pmVar12 = std::
                      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                      ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                    *)&sigFuncs.List.
                                       super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                       ._M_impl._M_node._M_size,(key_type *)&allUsedParams);
            std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::push_back
                      (&pmVar12->callRefs,(value_type *)&calledType);
          }
          __gnu_cxx::
          __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
          ::operator++(&__end3_1);
        }
        pmVar12 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)&sigFuncs.List.
                                   super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                   ._M_impl._M_node._M_size,
                               (key_type *)&(info->usedParams)._M_h._M_bucket_count);
        __end3_2 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::begin(&this_01->usedParams);
        _Stack_370._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::end(&this_01->usedParams);
        while (bVar3 = std::__detail::operator!=
                                 (&__end3_2.super__Node_iterator_base<unsigned_int,_false>,
                                  &stack0xfffffffffffffc90), bVar3) {
          puVar9 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3_2);
          local_374 = *puVar9;
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::insert(&pmVar12->usedParams,&local_374);
          std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3_2);
        }
        if ((this_01->optimizable & 1U) == 0) {
          pmVar12 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&sigFuncs.List.
                                     super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                     ._M_impl._M_node._M_size,
                                 (key_type *)&(info->usedParams)._M_h._M_bucket_count);
          pmVar12->optimizable = false;
        }
        this_02 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                  ::operator[]((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                *)&__range2,(HeapType *)&(info->usedParams)._M_h._M_bucket_count);
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::push_back
                  (this_02,(value_type *)&info);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ::begin(&local_18->exports);
      exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
            std::
            vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ::end(&pMVar2->exports);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                 *)&exp), bVar3) {
        this_03 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                  ::operator*(&__end2_1);
        pEVar10 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                            (this_03);
        pMVar2 = local_18;
        if (pEVar10->kind == Function) {
          pEVar10 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                              (this_03);
          subTypes.typeSubTypes._M_h._M_single_bucket =
               (__node_base_ptr)(pEVar10->value).super_IString.str._M_len;
          pFVar11 = Module::getFunction(pMVar2,(Name)(pEVar10->value).super_IString.str);
          pmVar12 = std::
                    unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                    ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                  *)&sigFuncs.List.
                                     super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                     ._M_impl._M_node._M_size,&pFVar11->type);
          pmVar12->optimizable = false;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
        ::operator++(&__end2_1);
      }
      SubTypes::SubTypes((SubTypes *)&__range2_2,local_18);
      __end2_2 = InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                 ::begin((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                          *)&__range2);
      local_430._M_node =
           (_List_node_base *)
           InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
           ::end((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                  *)&__range2);
      while (bVar3 = std::operator!=(&__end2_2,&local_430), bVar3) {
        __in = std::
               _List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
               ::operator*(&__end2_2);
        this_04 = std::
                  get<0ul,wasm::HeapType_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                            (__in);
        sig.results.id =
             (uintptr_t)
             std::
             get<1ul,wasm::HeapType_const,std::vector<wasm::Function*,std::allocator<wasm::Function*>>>
                       (__in);
        SVar18 = HeapType::getSignature(this_04);
        sig.params = SVar18.results.id;
        info_1 = (mapped_type *)SVar18.params.id;
        pmVar12 = std::
                  unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                  ::operator[]((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                                *)&sigFuncs.List.
                                   super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                   ._M_impl._M_node._M_size,this_04);
        this_05 = &pmVar12->usedParams;
        sVar13 = wasm::Type::size((Type *)&info_1);
        if ((pmVar12->optimizable & 1U) != 0) {
          this_06 = SubTypes::getStrictSubTypes((SubTypes *)&__range2_2,(HeapType)this_04->id);
          bVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty(this_06);
          if (bVar3) {
            oVar19 = HeapType::getSuperType(this_04);
            optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 oVar19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::HeapType>._M_payload;
            bVar3 = std::optional::operator_cast_to_bool
                              ((optional *)
                               &optimizedIndexes.
                                super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar3) {
              this_07 = std::optional<wasm::HeapType>::operator->
                                  ((optional<wasm::HeapType> *)
                                   &optimizedIndexes.
                                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = HeapType::isSignature(this_07);
              if (bVar3) goto LAB_019a3f86;
            }
            ParamUtils::applyConstantValues
                      ((SortedVector *)&__range3_3,
                       (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)sig.results.id
                       ,&pmVar12->calls,&pmVar12->callRefs,local_18);
            __end3_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3_3
                                 );
            iStack_4b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    &__range3_3);
            while (bVar3 = __gnu_cxx::operator!=(&__end3_3,&stack0xfffffffffffffb48), bVar3) {
              puVar14 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end3_3);
              unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *puVar14;
              std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::erase(this_05,(key_type *)
                              ((long)&unusedParams.
                                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
              __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&__end3_3);
            }
            sVar15 = std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::size(this_05);
            if (sVar15 == sVar13) {
              unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 0xd;
            }
            else {
              SortedVector::SortedVector((SortedVector *)local_4d8);
              for (oldParams.id._4_4_ = 0; TVar1.id = sig.results.id, oldParams.id._4_4_ < sVar13;
                  oldParams.id._4_4_ = oldParams.id._4_4_ + 1) {
                sVar15 = std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count(this_05,(key_type *)((long)&oldParams.id + 4));
                if (sVar15 == 0) {
                  SortedVector::insert((SortedVector *)local_4d8,oldParams.id._4_4_);
                }
              }
              removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)info_1;
              SortedVector::SortedVector
                        ((SortedVector *)
                         &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (SortedVector *)local_4d8);
              pMVar2 = local_18;
              runner = Pass::getPassRunner(&this->super_Pass);
              ParamUtils::removeParameters
                        ((SortedVector *)local_500,
                         (vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)TVar1.id,
                         (SortedVector *)
                         &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&pmVar12->calls,
                         &pmVar12->callRefs,pMVar2,runner);
              SortedVector::~SortedVector
                        ((SortedVector *)
                         &newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_500);
              if (bVar3) {
                unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 0xd;
              }
              else {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_530);
                for (local_534 = 0; local_534 < sVar13; local_534 = local_534 + 1) {
                  bVar3 = SortedVector::has((SortedVector *)local_500,local_534);
                  if (!bVar3) {
                    __x = wasm::Type::operator[]
                                    ((Type *)&removedIndexes.
                                              super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                                              .
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (ulong)local_534);
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_530,__x);
                  }
                }
                Tuple::Tuple(&local_568,(TypeList *)local_530);
                wasm::Type::Type(&local_550,&local_568);
                Signature::Signature(&local_548,local_550,sig.params);
                pmVar16 = std::
                          unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
                          ::operator[](&this->newSignatures,this_04);
                (pmVar16->params).id = local_548.params.id;
                (pmVar16->results).id = local_548.results.id;
                Tuple::~Tuple(&local_568);
                TVar1 = sig.results;
                __end3_4 = std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::begin
                                     ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *
                                      )sig.results.id);
                func_2 = (Function *)
                         std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::end
                                   ((vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)
                                    TVar1.id);
                while (bVar3 = __gnu_cxx::operator!=
                                         (&__end3_4,
                                          (__normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                                           *)&func_2), bVar3) {
                  ppFVar17 = __gnu_cxx::
                             __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                             ::operator*(&__end3_4);
                  ((*ppFVar17)->type).id = this_04->id;
                  __gnu_cxx::
                  __normal_iterator<wasm::Function_**,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                  ::operator++(&__end3_4);
                }
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_530);
                unusedParams.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              }
              SortedVector::~SortedVector((SortedVector *)local_500);
              SortedVector::~SortedVector((SortedVector *)local_4d8);
            }
            SortedVector::~SortedVector((SortedVector *)&__range3_3);
          }
        }
LAB_019a3f86:
        std::
        _List_iterator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>
        ::operator++(&__end2_2);
      }
      GlobalTypeRewriter::updateSignatures(&this->newSignatures,local_18);
      SubTypes::~SubTypes((SubTypes *)&__range2_2);
      InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
      ::~InsertOrderedMap((InsertOrderedMap<wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>
                           *)&__range2);
      std::
      unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
      ::~unordered_map((unordered_map<wasm::HeapType,_Info,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_Info>_>_>
                        *)&sigFuncs.List.
                           super__List_base<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                           ._M_impl._M_node._M_size);
      wasm::ModuleUtils::
      ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
      ~ParallelFunctionAnalysis
                ((ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                  *)local_1e8);
    }
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "SignaturePruning requires --closed-world";
    }

    if (!module->tables.empty()) {
      // When there are tables we must also take their types into account, which
      // would require us to take call_indirect, element segments, etc. into
      // account. For now, do nothing if there are tables.
      // TODO
      return;
    }

    // First, find all the information we need. Start by collecting inside each
    // function in parallel.

    struct Info {
      std::vector<Call*> calls;
      std::vector<CallRef*> callRefs;

      std::unordered_set<Index> usedParams;

      // If we set this to false, we may not attempt to perform any optimization
      // whatsoever on this data.
      bool optimizable = true;
    };

    ModuleUtils::ParallelFunctionAnalysis<Info> analysis(
      *module, [&](Function* func, Info& info) {
        if (func->imported()) {
          // Imports cannot be modified.
          info.optimizable = false;
          return;
        }

        info.calls = std::move(FindAll<Call>(func->body).list);
        info.callRefs = std::move(FindAll<CallRef>(func->body).list);
        info.usedParams = ParamUtils::getUsedParams(func);
      });

    // A map of types to all the information combined over all the functions
    // with that type.
    std::unordered_map<HeapType, Info> allInfo;

    // Map heap types to all functions with that type.
    InsertOrderedMap<HeapType, std::vector<Function*>> sigFuncs;

    // Combine all the information we gathered into that map, iterating in a
    // deterministic order as we build up vectors where the order matters.
    for (auto& f : module->functions) {
      auto* func = f.get();
      auto& info = analysis.map[func];

      // For direct calls, add each call to the type of the function being
      // called.
      for (auto* call : info.calls) {
        allInfo[module->getFunction(call->target)->type].calls.push_back(call);

        // Intrinsics limit our ability to optimize in some cases. We will avoid
        // modifying any type that is used by call.without.effects, to avoid
        // the complexity of handling that. After intrinsics are lowered,
        // this optimization will be able to run at full power anyhow.
        if (Intrinsics(*module).isCallWithoutEffects(call)) {
          // The last operand is the actual call target.
          auto* target = call->operands.back();
          if (target->type != Type::unreachable) {
            allInfo[target->type.getHeapType()].optimizable = false;
          }
        }
      }

      // For indirect calls, add each call_ref to the type the call_ref uses.
      for (auto* callRef : info.callRefs) {
        auto calledType = callRef->target->type;
        if (calledType != Type::unreachable) {
          allInfo[calledType.getHeapType()].callRefs.push_back(callRef);
        }
      }

      // A parameter used in this function is used in the heap type - just one
      // function is enough to prevent the parameter from being removed.
      auto& allUsedParams = allInfo[func->type].usedParams;
      for (auto index : info.usedParams) {
        allUsedParams.insert(index);
      }

      if (!info.optimizable) {
        allInfo[func->type].optimizable = false;
      }

      sigFuncs[func->type].push_back(func);
    }

    // Exported functions cannot be modified.
    for (auto& exp : module->exports) {
      if (exp->kind == ExternalKind::Function) {
        auto* func = module->getFunction(exp->value);
        allInfo[func->type].optimizable = false;
      }
    }

    // A type must have the same number of parameters and results as its
    // supertypes and subtypes, so we only attempt to modify types without
    // supertypes or subtypes.
    // TODO We could handle "cycles" where we remove fields from a group of
    //      types with subtyping relations at once.
    SubTypes subTypes(*module);

    // Find parameters to prune.
    //
    // TODO: The order matters here, and more than one cycle can find more work
    //       in some cases, as finding a parameter is a constant and removing it
    //       can lead to another call (that receives that parameter's value) to
    //       now have constant parameters as well, and so it becomes
    //       optimizable. We could do a topological sort or greatest fixed point
    //       analysis to be optimal (that could handle a recursive call with a
    //       constant).
    for (auto& [type, funcs] : sigFuncs) {
      auto sig = type.getSignature();
      auto& info = allInfo[type];
      auto& usedParams = info.usedParams;
      auto numParams = sig.params.size();

      if (!info.optimizable) {
        continue;
      }

      if (!subTypes.getStrictSubTypes(type).empty()) {
        continue;
      }
      if (auto super = type.getSuperType()) {
        if (super->isSignature()) {
          continue;
        }
      }

      // Apply constant indexes: find the parameters that are always sent a
      // constant value, and apply that value in the function. That then makes
      // the parameter unused (since the applied value makes us ignore the value
      // arriving in the parameter).
      auto optimizedIndexes = ParamUtils::applyConstantValues(
        funcs, info.calls, info.callRefs, module);
      for (auto i : optimizedIndexes) {
        usedParams.erase(i);
      }

      if (usedParams.size() == numParams) {
        // All parameters are used, give up on this one.
        continue;
      }

      // We found possible work! Find the specific params that are unused & try
      // to prune them.
      SortedVector unusedParams;
      for (Index i = 0; i < numParams; i++) {
        if (usedParams.count(i) == 0) {
          unusedParams.insert(i);
        }
      }

      auto oldParams = sig.params;
      auto removedIndexes = ParamUtils::removeParameters(funcs,
                                                         unusedParams,
                                                         info.calls,
                                                         info.callRefs,
                                                         module,
                                                         getPassRunner());
      if (removedIndexes.empty()) {
        continue;
      }

      // Success! Update the types.
      std::vector<Type> newParams;
      for (Index i = 0; i < numParams; i++) {
        if (!removedIndexes.has(i)) {
          newParams.push_back(oldParams[i]);
        }
      }

      // Create a new signature. When the TypeRewriter operates below it will
      // modify the existing heap type in place to change its signature to this
      // one (which preserves identity, that is, even if after pruning the new
      // signature is structurally identical to another one, it will remain
      // nominally different from those).
      newSignatures[type] = Signature(Type(newParams), sig.results);

      // removeParameters() updates the type as it goes, but in this pass we
      // need the type to match the other locations, nominally. That is, we need
      // all the functions of a particular type to still have the same type
      // after this operation, and that must be the exact same type at the
      // relevant call_refs and so forth. The TypeRewriter below will do the
      // right thing as it rewrites everything all at once, so we do not want
      // the type to be modified by removeParameters(), and so we undo the type
      // it made.
      //
      // Note that we cannot just ask removeParameters() to not update the type,
      // as it adds a new local there, whose index depends on the type (which
      // contains the # of parameters, and that determine where non-parameter
      // local indexes begin). Rather than have it update the type and then undo
      // that, which would add more complexity in that method, undo the change
      // here.
      for (auto* func : funcs) {
        func->type = type;
      }
    }

    // Rewrite the types.
    GlobalTypeRewriter::updateSignatures(newSignatures, *module);
  }